

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O2

mg_unbound_relationship *
mg_unbound_relationship_make(int64_t id,mg_string *type,mg_map *properties)

{
  mg_unbound_relationship *pmVar1;
  
  pmVar1 = (mg_unbound_relationship *)mg_allocator_malloc(&mg_system_allocator,0x18);
  if (pmVar1 != (mg_unbound_relationship *)0x0) {
    pmVar1->id = id;
    pmVar1->type = type;
    pmVar1->properties = properties;
  }
  return pmVar1;
}

Assistant:

mg_unbound_relationship *mg_unbound_relationship_make(int64_t id,
                                                      mg_string *type,
                                                      mg_map *properties) {
  mg_unbound_relationship *rel = mg_allocator_malloc(
      &mg_system_allocator, sizeof(mg_unbound_relationship));
  if (!rel) {
    return NULL;
  }
  rel->id = id;
  rel->type = type;
  rel->properties = properties;
  return rel;
}